

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

void __thiscall
TPZSparseBlockDiagonal<double>::TPZSparseBlockDiagonal
          (TPZSparseBlockDiagonal<double> *this,TPZVec<long> *blockgraph,
          TPZVec<long> *blockgraphindex,int64_t rows)

{
  long lVar1;
  int64_t iVar2;
  TPZVec<int> *blocksize;
  long *plVar3;
  int *piVar4;
  int64_t in_RCX;
  TPZVec<long> *in_RDX;
  TPZBlockDiagonal<double> *in_RDI;
  int64_t ibl;
  int64_t numbl;
  int iVar5;
  TPZVec<long> *in_stack_ffffffffffffff78;
  TPZVec<long> *in_stack_ffffffffffffff80;
  void **in_stack_ffffffffffffff98;
  TPZVec<double> *newsize;
  long local_50;
  TPZBlockDiagonal<double> *in_stack_ffffffffffffffc0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZSparseBlockDiagonal<double>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZBlockDiagonal<double>::TPZBlockDiagonal(in_RDI,in_stack_ffffffffffffff98);
  (in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSparseBlockDiagonal_02419660;
  TPZVec<long>::TPZVec(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  newsize = &in_RDI[1].fStorage;
  TPZVec<long>::TPZVec(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  iVar2 = TPZVec<long>::NElements(in_RDX);
  blocksize = (TPZVec<int> *)(iVar2 + -1);
  TPZVec<int>::Resize((TPZVec<int> *)in_RDI,(int64_t)newsize);
  for (local_50 = 0; local_50 < (long)blocksize; local_50 = local_50 + 1) {
    plVar3 = TPZVec<long>::operator[](in_RDX,local_50 + 1);
    iVar5 = (int)*plVar3;
    plVar3 = TPZVec<long>::operator[](in_RDX,local_50);
    lVar1 = *plVar3;
    piVar4 = TPZVec<int>::operator[](&in_RDI->fBlockSize,local_50);
    *piVar4 = iVar5 - (int)lVar1;
  }
  TPZBlockDiagonal<double>::Initialize(in_stack_ffffffffffffffc0,blocksize);
  (in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = in_RCX;
  (in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = in_RCX;
  return;
}

Assistant:

TPZSparseBlockDiagonal<TVar>::TPZSparseBlockDiagonal(TPZVec<int64_t> &blockgraph, TPZVec<int64_t> &blockgraphindex,int64_t rows) : TPZRegisterClassId(&TPZSparseBlockDiagonal::ClassId), fBlock(blockgraph), fBlockIndex(blockgraphindex)
{
	int64_t numbl = blockgraphindex.NElements()-1;
	this->fBlockSize.Resize(numbl);
	int64_t ibl;
	for(ibl=0; ibl<numbl; ibl++)
	{
		this->fBlockSize[ibl] = blockgraphindex[ibl+1]-blockgraphindex[ibl];
	}
	this->Initialize(this->fBlockSize);
	this->fRow = rows;
	this->fCol = rows;
}